

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::SourceBuffer>::reallocateTo
          (SmallVectorBase<slang::SourceBuffer> *this,size_type newCapacity)

{
  undefined8 *puVar1;
  pointer pSVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer pSVar5;
  long lVar6;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)0x18;
  pSVar5 = (pointer)detail::allocArray(newCapacity,0x18);
  pSVar2 = this->data_;
  sVar3 = this->len;
  for (lVar6 = 0; sVar3 * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
    ctx = (EVP_PKEY_CTX *)((long)&(pSVar2->data)._M_len + lVar6);
    puVar1 = (undefined8 *)((long)&(pSVar5->data)._M_len + lVar6);
    puVar1[2] = *(undefined8 *)(ctx + 0x10);
    uVar4 = *(undefined8 *)(ctx + 8);
    *puVar1 = *(undefined8 *)ctx;
    puVar1[1] = uVar4;
  }
  cleanup(this,ctx);
  this->cap = newCapacity;
  this->data_ = pSVar5;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)detail::allocArray(newCapacity, sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }